

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uchar *puVar15;
  size_t left;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uchar *puVar21;
  size_t left_1;
  size_t sVar22;
  ulong uVar23;
  uchar *puVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  uint local_a8;
  ulong local_58;
  
  uVar5 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar5 = windowsize;
  }
  uVar11 = 0x40;
  if (0x1fff < windowsize) {
    uVar11 = 0x102;
  }
  local_a8 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar6 = windowsize - 1;
    local_a8 = 0x5a;
    if ((windowsize & uVar6) == 0) {
      uVar14 = 0x102;
      if (nicematch < 0x102) {
        uVar14 = nicematch;
      }
      local_a8 = 0;
      if (inpos < insize) {
        puVar9 = in + insize;
        local_58 = 0;
        uVar4 = 0;
        bVar3 = false;
        uVar25 = 0;
        local_a8 = 0;
        do {
          uVar7 = getHash(in,insize,inpos);
          uVar23 = 0;
          if (uVar7 == 0) {
            if (uVar25 == 0) {
              puVar15 = in + inpos + 0x102;
              if (puVar9 < in + inpos + 0x102) {
                puVar15 = puVar9;
              }
              for (puVar24 = in + inpos; (puVar24 != puVar15 && (*puVar24 == '\0'));
                  puVar24 = puVar24 + 1) {
              }
              uVar23 = (ulong)(uint)((int)puVar24 - (int)(in + inpos));
            }
            else {
              if ((insize < uVar25 + inpos) || (in[(uVar25 + inpos) - 1] != '\0')) {
                uVar25 = uVar25 - 1;
              }
              uVar23 = (ulong)uVar25;
            }
          }
          uVar25 = (uint)uVar23;
          uVar16 = (ulong)((uint)inpos & uVar6);
          updateHashChain(hash,uVar16,uVar7,(unsigned_short)uVar23);
          uVar10 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar10 = insize;
          }
          if (uVar5 == 0) {
            uVar12 = 0;
            uVar26 = 0;
          }
          else {
            puVar15 = in + inpos;
            uVar26 = 0;
            uVar12 = 0;
            uVar13 = 0;
            uVar19 = (ulong)hash->chain[uVar16];
            uVar8 = 1;
            do {
              uVar17 = 0;
              if (uVar16 < uVar19) {
                uVar17 = (ulong)windowsize;
              }
              uVar17 = (uVar16 - uVar19) + uVar17;
              if ((uint)uVar17 < (uint)uVar13) break;
              if (uVar17 != 0) {
                puVar21 = in + (inpos - (uVar17 & 0xffffffff));
                puVar24 = puVar15;
                if (2 < uVar25) {
                  uVar13 = (ulong)(uint)hash->zeros[uVar19];
                  if (uVar25 < hash->zeros[uVar19]) {
                    uVar13 = uVar23;
                  }
                  puVar21 = puVar21 + uVar13;
                  puVar24 = puVar15 + uVar13;
                }
                for (; (puVar24 != in + uVar10 && (*puVar21 == *puVar24)); puVar21 = puVar21 + 1) {
                  puVar24 = puVar24 + 1;
                }
                uVar18 = (int)puVar24 - (int)puVar15;
                if ((uVar26 < uVar18) &&
                   (uVar12 = uVar17 & 0xffffffff, uVar26 = uVar18, uVar14 <= uVar18)) {
                  uVar12 = uVar17 & 0xffffffff;
                  break;
                }
              }
              uVar2 = hash->chain[uVar19];
              uVar20 = (ulong)uVar2;
              if ((ushort)uVar19 == uVar2) break;
              if ((uVar25 < 3) || (uVar26 <= uVar25)) {
                if (hash->val[uVar2] != uVar7) break;
              }
              else {
                uVar20 = (ulong)hash->chainz[uVar19];
                if (uVar25 != hash->zeros[uVar20]) break;
              }
              bVar27 = uVar8 != uVar5;
              uVar13 = uVar17;
              uVar19 = uVar20;
              uVar8 = uVar8 + 1;
            } while (bVar27);
          }
          uVar8 = (uint)uVar12;
          if (lazymatching == 0) goto LAB_00115b76;
          if (((bVar3) || (uVar26 < 3)) || (uVar11 < uVar26 || 0x101 < uVar26)) {
            if (!bVar3) {
              bVar3 = false;
              goto LAB_00115b76;
            }
            if (inpos == 0) {
              bVar3 = false;
              local_a8 = 0x51;
              inpos = 0;
            }
            else {
              if (uVar26 <= uVar4 + 1) {
                hash->head[uVar7] = -1;
                hash->headz[uVar23] = -1;
                inpos = inpos - 1;
                bVar3 = false;
                uVar8 = (uint)local_58;
                uVar26 = uVar4;
LAB_00115b76:
                if ((2 < uVar26) && (windowsize < uVar8)) {
                  bVar27 = false;
                  local_a8 = 0x56;
                  goto LAB_00115ea1;
                }
                if (((uVar26 < 3) || (uVar26 < minmatch)) || ((uVar26 == 3 && (0x1000 < uVar8)))) {
                  bVar1 = in[inpos];
                  uVar7 = uivector_resize(out,out->size + 1);
                  if (uVar7 == 0) goto LAB_00115e98;
                  out->data[out->size - 1] = (uint)bVar1;
                }
                else {
                  uVar10 = 0x1c;
                  uVar16 = 1;
                  do {
                    uVar12 = uVar10 + uVar16 >> 1;
                    if (LENGTHBASE[uVar12] < uVar26) {
                      uVar16 = uVar12 + 1;
                    }
                    else {
                      uVar10 = uVar12 - 1;
                    }
                  } while (uVar16 <= uVar10);
                  if ((0x1c < uVar16) || (uVar26 < LENGTHBASE[uVar16])) {
                    uVar16 = uVar16 - 1;
                  }
                  uVar25 = LENGTHBASE[uVar16 & 0xffffffff];
                  uVar10 = 0x1d;
                  uVar12 = 1;
                  do {
                    uVar13 = uVar10 + uVar12 >> 1;
                    if (DISTANCEBASE[uVar13] < uVar8) {
                      uVar12 = uVar13 + 1;
                    }
                    else {
                      uVar10 = uVar13 - 1;
                    }
                  } while (uVar12 <= uVar10);
                  if ((0x1d < uVar12) || (uVar8 < DISTANCEBASE[uVar12])) {
                    uVar12 = uVar12 - 1;
                  }
                  uVar7 = DISTANCEBASE[uVar12 & 0xffffffff];
                  uVar18 = uivector_resize(out,out->size + 1);
                  if (uVar18 != 0) {
                    out->data[out->size - 1] = (int)uVar16 + 0x101;
                  }
                  uVar18 = uivector_resize(out,out->size + 1);
                  if (uVar18 != 0) {
                    out->data[out->size - 1] = uVar26 - uVar25;
                  }
                  uVar25 = uivector_resize(out,out->size + 1);
                  if (uVar25 != 0) {
                    out->data[out->size - 1] = (uint)uVar12;
                  }
                  uVar25 = uivector_resize(out,out->size + 1);
                  if (uVar25 != 0) {
                    out->data[out->size - 1] = uVar8 - uVar7;
                  }
                  if (uVar26 < 3) {
                    uVar26 = 2;
                  }
                  uVar7 = 1;
                  sVar22 = inpos;
                  do {
                    uVar25 = (uint)uVar23;
                    inpos = sVar22 + 1;
                    uVar8 = getHash(in,insize,inpos);
                    uVar10 = 0;
                    if (uVar8 == 0) {
                      if (uVar25 == 0) {
                        puVar15 = in + sVar22 + 0x103;
                        if (puVar9 < in + sVar22 + 0x103) {
                          puVar15 = puVar9;
                        }
                        for (puVar24 = in + inpos; (puVar24 != puVar15 && (*puVar24 == '\0'));
                            puVar24 = puVar24 + 1) {
                        }
                        uVar10 = (ulong)(uint)((int)puVar24 - (int)(in + inpos));
                      }
                      else {
                        if ((insize < uVar23 + inpos) || (in[uVar23 + sVar22] != '\0')) {
                          uVar25 = uVar25 - 1;
                        }
                        uVar10 = (ulong)uVar25;
                      }
                    }
                    uVar25 = (uint)uVar10;
                    updateHashChain(hash,(ulong)((uint)inpos & uVar6),uVar8,(unsigned_short)uVar10);
                    uVar7 = uVar7 + 1;
                    sVar22 = inpos;
                    uVar23 = uVar10;
                  } while (uVar7 != uVar26);
                }
                bVar27 = true;
                goto LAB_00115ea1;
              }
              bVar1 = in[inpos - 1];
              uVar7 = uivector_resize(out,out->size + 1);
              if (uVar7 != 0) {
                out->data[out->size - 1] = (uint)bVar1;
                bVar3 = false;
                goto LAB_00115b76;
              }
              bVar3 = false;
LAB_00115e98:
              local_a8 = 0x53;
            }
            bVar27 = false;
          }
          else {
            bVar27 = true;
            bVar3 = true;
            local_58 = uVar12;
            uVar4 = uVar26;
          }
LAB_00115ea1:
        } while ((bVar27) && (inpos = inpos + 1, inpos < insize));
      }
    }
  }
  return local_a8;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
	const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
	unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
	size_t pos;
	unsigned i, error = 0;
	/*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
	unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
	unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

	unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
	unsigned numzeros = 0;

	unsigned offset; /*the offset represents the distance in LZ77 terminology*/
	unsigned length;
	unsigned lazy = 0;
	unsigned lazylength = 0, lazyoffset = 0;
	unsigned hashval;
	unsigned current_offset, current_length;
	unsigned prev_offset;
	const unsigned char *lastptr, *foreptr, *backptr;
	unsigned hashpos;

	if (windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
	if ((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

	if (nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

	for (pos = inpos; pos < insize; ++pos)
	{
		size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
		unsigned chainlength = 0;

		hashval = getHash(in, insize, pos);

		if (usezeros && hashval == 0)
		{
			if (numzeros == 0) numzeros = countZeros(in, insize, pos);
			else if (pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
		}
		else
		{
			numzeros = 0;
		}

		updateHashChain(hash, wpos, hashval, numzeros);

		/*the length and offset found for the current position*/
		length = 0;
		offset = 0;

		hashpos = hash->chain[wpos];

		lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

		/*search for the longest string*/
		prev_offset = 0;
		for (;;)
		{
			if (chainlength++ >= maxchainlength) break;
			current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

			if (current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
			prev_offset = current_offset;
			if (current_offset > 0)
			{
				/*test the next characters*/
				foreptr = &in[pos];
				backptr = &in[pos - current_offset];

				/*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
				if (numzeros >= 3)
				{
					unsigned skip = hash->zeros[hashpos];
					if (skip > numzeros) skip = numzeros;
					backptr += skip;
					foreptr += skip;
				}

				while (foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
				{
					++backptr;
					++foreptr;
				}
				current_length = (unsigned)(foreptr - &in[pos]);

				if (current_length > length)
				{
					length = current_length; /*the longest length*/
					offset = current_offset; /*the offset that is related to this longest length*/
					/*jump out once a length of max length is found (speed gain). This also jumps
					out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
					if (current_length >= nicematch) break;
				}
			}

			if (hashpos == hash->chain[hashpos]) break;

			if (numzeros >= 3 && length > numzeros)
			{
				hashpos = hash->chainz[hashpos];
				if (hash->zeros[hashpos] != numzeros) break;
			}
			else
			{
				hashpos = hash->chain[hashpos];
				/*outdated hash value, happens if particular value was not encountered in whole last window*/
				if (hash->val[hashpos] != (int)hashval) break;
			}
		}

		if (lazymatching)
		{
			if (!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
			{
				lazy = 1;
				lazylength = length;
				lazyoffset = offset;
				continue; /*try the next byte*/
			}
			if (lazy)
			{
				lazy = 0;
				if (pos == 0) ERROR_BREAK(81);
				if (length > lazylength + 1)
				{
					/*push the previous character as literal*/
					if (!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
				}
				else
				{
					length = lazylength;
					offset = lazyoffset;
					hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
					hash->headz[numzeros] = -1; /*idem*/
					--pos;
				}
			}
		}
		if (length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

		/*encode it as length/distance pair or literal value*/
		if (length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
		{
			if (!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
		}
		else if (length < minmatch || (length == 3 && offset > 4096))
		{
			/*compensate for the fact that longer offsets have more extra bits, a
			length of only 3 may be not worth it then*/
			if (!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
		}
		else
		{
			addLengthDistance(out, length, offset);
			for (i = 1; i < length; ++i)
			{
				++pos;
				wpos = pos & (windowsize - 1);
				hashval = getHash(in, insize, pos);
				if (usezeros && hashval == 0)
				{
					if (numzeros == 0) numzeros = countZeros(in, insize, pos);
					else if (pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
				}
				else
				{
					numzeros = 0;
				}
				updateHashChain(hash, wpos, hashval, numzeros);
			}
		}
	} /*end of the loop through each character of input*/

	return error;
}